

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O1

drmp3_bool32
drmp3_calculate_seek_points(drmp3 *pMP3,drmp3_uint32 *pSeekPointCount,drmp3_seek_point *pSeekPoints)

{
  drmp3_seek_point *pdVar1;
  drmp3_uint64 frameIndex;
  drmp3_uint64 dVar2;
  drmp3_bool32 dVar3;
  drmp3_uint32 dVar4;
  drmp3_uint32 dVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  drmp3_uint64 totalPCMFrameCount;
  drmp3_uint64 totalMP3FrameCount;
  drmp3__seeking_mp3_frame_info mp3FrameInfo [3];
  float local_bc;
  ulong local_78;
  ulong local_70;
  drmp3_uint64 local_68;
  ulong uStack_60;
  drmp3_uint64 local_58;
  ulong uStack_50;
  drmp3_uint64 local_48;
  ulong uStack_40;
  
  if (pSeekPoints == (drmp3_seek_point *)0x0 ||
      (pSeekPointCount == (drmp3_uint32 *)0x0 || pMP3 == (drmp3 *)0x0)) {
    return 0;
  }
  uVar10 = (ulong)*pSeekPointCount;
  if (uVar10 == 0) {
    return 0;
  }
  frameIndex = pMP3->currentPCMFrame;
  dVar3 = drmp3_get_mp3_and_pcm_frame_count(pMP3,&local_70,&local_78);
  if (dVar3 == 0) {
    return 0;
  }
  if (local_70 < 3) {
    pSeekPoints->seekPosInBytes = 0;
    pSeekPoints->pcmFrameIndex = 0;
    pSeekPoints->mp3FramesToDiscard = 0;
    pSeekPoints->pcmFramesToDiscard = 0;
    dVar5 = 1;
LAB_00111971:
    *pSeekPointCount = dVar5;
    dVar3 = 1;
  }
  else {
    uVar6 = (ulong)((int)local_70 - 1);
    if (uVar10 <= local_70 - 1) {
      uVar6 = uVar10;
    }
    dVar5 = (drmp3_uint32)uVar6;
    dVar3 = (*pMP3->onSeek)(pMP3->pUserData,0,drmp3_seek_origin_start);
    if (dVar3 != 0) {
      uVar10 = 0;
      pMP3->pcmFramesConsumedInMP3Frame = 0;
      pMP3->pcmFramesRemainingInMP3Frame = 0;
      pMP3->dataSize = 0;
      pMP3->currentPCMFrame = 0;
      pMP3->streamCursor = 0;
      pMP3->field_0x3ea0 = pMP3->field_0x3ea0 & 0xfe;
      (pMP3->decoder).header[0] = '\0';
      local_bc = 0.0;
      lVar8 = 8;
      do {
        *(drmp3_uint64 *)((long)&local_70 + lVar8) = pMP3->streamCursor - pMP3->dataSize;
        *(ulong *)((long)&local_68 + lVar8) = uVar10;
        dVar4 = drmp3_decode_next_frame_ex(pMP3,(drmp3d_sample_t *)0x0);
        if (dVar4 == 0) goto LAB_00111c3a;
        local_bc = local_bc +
                   (float)(int)dVar4 / ((float)pMP3->mp3FrameSampleRate / (float)pMP3->sampleRate);
        uVar9 = (long)local_bc & 0xffffffff;
        local_bc = local_bc - (float)uVar9;
        uVar10 = uVar10 + uVar9;
        lVar8 = lVar8 + 0x10;
      } while (lVar8 != 0x38);
      if (dVar5 != 0) {
        uVar11 = 0;
        uVar9 = 0;
        do {
          uVar9 = uVar9 + local_78 / (dVar5 + 1);
          pdVar1 = pSeekPoints + uVar11;
          for (; uVar7 = uStack_50, dVar2 = local_58, uVar10 <= uVar9; uVar10 = uVar10 + uVar7) {
            local_58 = local_48;
            uStack_50 = uStack_40;
            local_68 = dVar2;
            uStack_60 = uVar7;
            local_48 = pMP3->streamCursor - pMP3->dataSize;
            uStack_40 = uVar10;
            dVar4 = drmp3_decode_next_frame_ex(pMP3,(drmp3d_sample_t *)0x0);
            if (dVar4 == 0) {
              pdVar1->seekPosInBytes = local_68;
              pdVar1->pcmFrameIndex = uVar9;
              pdVar1->mp3FramesToDiscard = 2;
              pdVar1->pcmFramesToDiscard = (short)uVar9 - (short)uStack_50;
              goto LAB_00111bc5;
            }
            local_bc = local_bc +
                       (float)(int)dVar4 /
                       ((float)pMP3->mp3FrameSampleRate / (float)pMP3->sampleRate);
            uVar7 = (long)local_bc & 0xffffffff;
            local_bc = local_bc - (float)uVar7;
          }
          pSeekPoints[uVar11].seekPosInBytes = local_68;
          pSeekPoints[uVar11].pcmFrameIndex = uVar9;
          pSeekPoints[uVar11].mp3FramesToDiscard = 2;
          pSeekPoints[uVar11].pcmFramesToDiscard = (short)uVar9 - (short)uStack_50;
LAB_00111bc5:
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar6);
      }
      dVar3 = (*pMP3->onSeek)(pMP3->pUserData,0,drmp3_seek_origin_start);
      if (dVar3 != 0) {
        pMP3->pcmFramesConsumedInMP3Frame = 0;
        pMP3->pcmFramesRemainingInMP3Frame = 0;
        pMP3->dataSize = 0;
        pMP3->currentPCMFrame = 0;
        pMP3->streamCursor = 0;
        pMP3->field_0x3ea0 = pMP3->field_0x3ea0 & 0xfe;
        (pMP3->decoder).header[0] = '\0';
        dVar3 = drmp3_seek_to_pcm_frame(pMP3,frameIndex);
        if (dVar3 == 0) {
          return 0;
        }
        goto LAB_00111971;
      }
    }
LAB_00111c3a:
    dVar3 = 0;
  }
  return dVar3;
}

Assistant:

DRMP3_API drmp3_bool32 drmp3_calculate_seek_points(drmp3* pMP3, drmp3_uint32* pSeekPointCount, drmp3_seek_point* pSeekPoints)
{
    drmp3_uint32 seekPointCount;
    drmp3_uint64 currentPCMFrame;
    drmp3_uint64 totalMP3FrameCount;
    drmp3_uint64 totalPCMFrameCount;

    if (pMP3 == NULL || pSeekPointCount == NULL || pSeekPoints == NULL) {
        return DRMP3_FALSE; /* Invalid args. */
    }

    seekPointCount = *pSeekPointCount;
    if (seekPointCount == 0) {
        return DRMP3_FALSE;  /* The client has requested no seek points. Consider this to be invalid arguments since the client has probably not intended this. */
    }

    /* We'll need to seek back to the current sample after calculating the seekpoints so we need to go ahead and grab the current location at the top. */
    currentPCMFrame = pMP3->currentPCMFrame;

    /* We never do more than the total number of MP3 frames and we limit it to 32-bits. */
    if (!drmp3_get_mp3_and_pcm_frame_count(pMP3, &totalMP3FrameCount, &totalPCMFrameCount)) {
        return DRMP3_FALSE;
    }

    /* If there's less than DRMP3_SEEK_LEADING_MP3_FRAMES+1 frames we just report 1 seek point which will be the very start of the stream. */
    if (totalMP3FrameCount < DRMP3_SEEK_LEADING_MP3_FRAMES+1) {
        seekPointCount = 1;
        pSeekPoints[0].seekPosInBytes     = 0;
        pSeekPoints[0].pcmFrameIndex      = 0;
        pSeekPoints[0].mp3FramesToDiscard = 0;
        pSeekPoints[0].pcmFramesToDiscard = 0;
    } else {
        drmp3_uint64 pcmFramesBetweenSeekPoints;
        drmp3__seeking_mp3_frame_info mp3FrameInfo[DRMP3_SEEK_LEADING_MP3_FRAMES+1];
        drmp3_uint64 runningPCMFrameCount = 0;
        float runningPCMFrameCountFractionalPart = 0;
        drmp3_uint64 nextTargetPCMFrame;
        drmp3_uint32 iMP3Frame;
        drmp3_uint32 iSeekPoint;

        if (seekPointCount > totalMP3FrameCount-1) {
            seekPointCount = (drmp3_uint32)totalMP3FrameCount-1;
        }

        pcmFramesBetweenSeekPoints = totalPCMFrameCount / (seekPointCount+1);

        /*
        Here is where we actually calculate the seek points. We need to start by moving the start of the stream. We then enumerate over each
        MP3 frame.
        */
        if (!drmp3_seek_to_start_of_stream(pMP3)) {
            return DRMP3_FALSE;
        }

        /*
        We need to cache the byte positions of the previous MP3 frames. As a new MP3 frame is iterated, we cycle the byte positions in this
        array. The value in the first item in this array is the byte position that will be reported in the next seek point.
        */

        /* We need to initialize the array of MP3 byte positions for the leading MP3 frames. */
        for (iMP3Frame = 0; iMP3Frame < DRMP3_SEEK_LEADING_MP3_FRAMES+1; ++iMP3Frame) {
            drmp3_uint32 pcmFramesInCurrentMP3FrameIn;

            /* The byte position of the next frame will be the stream's cursor position, minus whatever is sitting in the buffer. */
            DRMP3_ASSERT(pMP3->streamCursor >= pMP3->dataSize);
            mp3FrameInfo[iMP3Frame].bytePos       = pMP3->streamCursor - pMP3->dataSize;
            mp3FrameInfo[iMP3Frame].pcmFrameIndex = runningPCMFrameCount;

            /* We need to get information about this frame so we can know how many samples it contained. */
            pcmFramesInCurrentMP3FrameIn = drmp3_decode_next_frame_ex(pMP3, NULL);
            if (pcmFramesInCurrentMP3FrameIn == 0) {
                return DRMP3_FALSE; /* This should never happen. */
            }

            drmp3__accumulate_running_pcm_frame_count(pMP3, pcmFramesInCurrentMP3FrameIn, &runningPCMFrameCount, &runningPCMFrameCountFractionalPart);
        }

        /*
        At this point we will have extracted the byte positions of the leading MP3 frames. We can now start iterating over each seek point and
        calculate them.
        */
        nextTargetPCMFrame = 0;
        for (iSeekPoint = 0; iSeekPoint < seekPointCount; ++iSeekPoint) {
            nextTargetPCMFrame += pcmFramesBetweenSeekPoints;

            for (;;) {
                if (nextTargetPCMFrame < runningPCMFrameCount) {
                    /* The next seek point is in the current MP3 frame. */
                    pSeekPoints[iSeekPoint].seekPosInBytes     = mp3FrameInfo[0].bytePos;
                    pSeekPoints[iSeekPoint].pcmFrameIndex      = nextTargetPCMFrame;
                    pSeekPoints[iSeekPoint].mp3FramesToDiscard = DRMP3_SEEK_LEADING_MP3_FRAMES;
                    pSeekPoints[iSeekPoint].pcmFramesToDiscard = (drmp3_uint16)(nextTargetPCMFrame - mp3FrameInfo[DRMP3_SEEK_LEADING_MP3_FRAMES-1].pcmFrameIndex);
                    break;
                } else {
                    size_t i;
                    drmp3_uint32 pcmFramesInCurrentMP3FrameIn;

                    /*
                    The next seek point is not in the current MP3 frame, so continue on to the next one. The first thing to do is cycle the cached
                    MP3 frame info.
                    */
                    for (i = 0; i < DRMP3_COUNTOF(mp3FrameInfo)-1; ++i) {
                        mp3FrameInfo[i] = mp3FrameInfo[i+1];
                    }

                    /* Cache previous MP3 frame info. */
                    mp3FrameInfo[DRMP3_COUNTOF(mp3FrameInfo)-1].bytePos       = pMP3->streamCursor - pMP3->dataSize;
                    mp3FrameInfo[DRMP3_COUNTOF(mp3FrameInfo)-1].pcmFrameIndex = runningPCMFrameCount;

                    /*
                    Go to the next MP3 frame. This shouldn't ever fail, but just in case it does we just set the seek point and break. If it happens, it
                    should only ever do it for the last seek point.
                    */
                    pcmFramesInCurrentMP3FrameIn = drmp3_decode_next_frame_ex(pMP3, NULL);
                    if (pcmFramesInCurrentMP3FrameIn == 0) {
                        pSeekPoints[iSeekPoint].seekPosInBytes     = mp3FrameInfo[0].bytePos;
                        pSeekPoints[iSeekPoint].pcmFrameIndex      = nextTargetPCMFrame;
                        pSeekPoints[iSeekPoint].mp3FramesToDiscard = DRMP3_SEEK_LEADING_MP3_FRAMES;
                        pSeekPoints[iSeekPoint].pcmFramesToDiscard = (drmp3_uint16)(nextTargetPCMFrame - mp3FrameInfo[DRMP3_SEEK_LEADING_MP3_FRAMES-1].pcmFrameIndex);
                        break;
                    }

                    drmp3__accumulate_running_pcm_frame_count(pMP3, pcmFramesInCurrentMP3FrameIn, &runningPCMFrameCount, &runningPCMFrameCountFractionalPart);
                }
            }
        }

        /* Finally, we need to seek back to where we were. */
        if (!drmp3_seek_to_start_of_stream(pMP3)) {
            return DRMP3_FALSE;
        }
        if (!drmp3_seek_to_pcm_frame(pMP3, currentPCMFrame)) {
            return DRMP3_FALSE;
        }
    }

    *pSeekPointCount = seekPointCount;
    return DRMP3_TRUE;
}